

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_buffer_reserve(ptls_buffer_t *buf,size_t delta)

{
  uint8_t *__dest;
  ulong local_30;
  size_t new_capacity;
  uint8_t *newp;
  size_t delta_local;
  ptls_buffer_t *buf_local;
  
  if (buf->base == (uint8_t *)0x0) {
    buf_local._4_4_ = 0x201;
  }
  else {
    if (buf->capacity < buf->off + delta) {
      local_30 = buf->capacity;
      if (local_30 < 0x400) {
        local_30 = 0x400;
      }
      do {
        local_30 = local_30 << 1;
      } while (local_30 < buf->off + delta);
      __dest = (uint8_t *)malloc(local_30);
      if (__dest == (uint8_t *)0x0) {
        return 0x201;
      }
      memcpy(__dest,buf->base,buf->off);
      ptls_buffer__release_memory(buf);
      buf->base = __dest;
      buf->capacity = local_30;
      buf->is_allocated = 1;
    }
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int ptls_buffer_reserve(ptls_buffer_t *buf, size_t delta)
{
    if (buf->base == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if (buf->capacity < buf->off + delta) {
        uint8_t *newp;
        size_t new_capacity = buf->capacity;
        if (new_capacity < 1024)
            new_capacity = 1024;
        do {
            new_capacity *= 2;
        } while (new_capacity < buf->off + delta);
        if ((newp = malloc(new_capacity)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(newp, buf->base, buf->off);
        ptls_buffer__release_memory(buf);
        buf->base = newp;
        buf->capacity = new_capacity;
        buf->is_allocated = 1;
    }

    return 0;
}